

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Citizen.cpp
# Opt level: O2

void Handlers::Citizen_Reply(Character *character,PacketReader *reader)

{
  World *pWVar1;
  bool bVar2;
  long lVar3;
  mapped_type *this;
  NPC_Data *pNVar4;
  undefined1 *puVar5;
  int questions_wrong;
  int iVar6;
  PacketBuilder reply;
  string answers [3];
  string local_50;
  
  lVar3 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&answers[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)answers + lVar3 + -0x10) = puVar5;
    *(undefined8 *)((long)answers + lVar3 + -8) = 0;
    *puVar5 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x70);
  PacketReader::GetShort(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetShort(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetBreakString_abi_cxx11_((string *)&reply,reader,0xff);
  std::__cxx11::string::operator=((string *)answers,(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  PacketReader::GetBreakString_abi_cxx11_((string *)&reply,reader,0xff);
  std::__cxx11::string::operator=((string *)(answers + 1),(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  PacketReader::GetEndString_abi_cxx11_((string *)&reply,reader);
  std::__cxx11::string::operator=((string *)(answers + 2),(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  if (character->npc_type == Inn) {
    if ((character->home)._M_string_length != 0) {
      pWVar1 = character->world;
      std::__cxx11::string::string
                ((string *)&reply,"CitizenSubscribeAnytime",(allocator *)&local_50);
      this = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)&reply);
      bVar2 = util::variant::GetBool(this);
      std::__cxx11::string::~string((string *)&reply);
      if (!bVar2) goto LAB_001ad4cf;
    }
    iVar6 = 0;
    for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x20) {
      util::lowercase((string *)&reply,(string *)((long)&answers[0]._M_dataplus._M_p + lVar3));
      pNVar4 = NPC::Data(character->npc);
      util::lowercase(&local_50,
                      (string *)
                      ((long)(((pNVar4->citizenship)._M_t.
                               super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                               .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl)->
                             answers)._M_elems + lVar3));
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &reply,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&reply);
      iVar6 = iVar6 + (uint)bVar2;
    }
    if (iVar6 == 0) {
      NPC::Data(character->npc);
      std::__cxx11::string::_M_assign((string *)&character->home);
    }
    PacketBuilder::PacketBuilder(&reply,PACKET_CITIZEN,PACKET_REPLY,1);
    PacketBuilder::AddChar(&reply,(uchar)iVar6);
    Character::Send(character,&reply);
    PacketBuilder::~PacketBuilder(&reply);
  }
LAB_001ad4cf:
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&answers[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

void Citizen_Reply(Character *character, PacketReader &reader)
{
	std::string answers[3];

	/*int session = */reader.GetShort();
	reader.GetByte();
	/*short npcid = */reader.GetShort();
	reader.GetByte();
	answers[0] = reader.GetBreakString();
	answers[1] = reader.GetBreakString();
	answers[2] = reader.GetEndString();

	if (character->npc_type == ENF::Inn && (character->home.size() == 0 || character->world->config["CitizenSubscribeAnytime"]))
	{
		int questions_wrong = 0;

		for (int i = 0; i < 3; ++i)
		{
			if (util::lowercase(answers[i]) != util::lowercase(character->npc->Data().citizenship->answers[i]))
			{
				++questions_wrong;
			}
		}

		if (questions_wrong == 0)
		{
			character->home = character->npc->Data().citizenship->home;
		}

		PacketBuilder reply(PACKET_CITIZEN, PACKET_REPLY, 1);
		reply.AddChar(questions_wrong);

		character->Send(reply);
	}
}